

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

string * __thiscall
soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,ModuleBase *m)

{
  char *in_RCX;
  string_view name;
  IdentifierPath local_e0;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [16];
  soul *local_18;
  ModuleBase *m_local;
  
  local_18 = this;
  m_local = (ModuleBase *)__return_storage_ptr__;
  (**(code **)(*(long *)this + 0x70))();
  IdentifierPath::toString_abi_cxx11_(&local_88,&local_e0);
  Program::stripRootNamespaceFromQualifiedPath(&local_68,&local_88);
  std::operator+(&local_48,"mod_",&local_68);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  name._M_len = local_28._8_8_;
  name._M_str = in_RCX;
  makeUID_abi_cxx11_(__return_storage_ptr__,local_28._0_8_,name);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  IdentifierPath::~IdentifierPath(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeUID (AST::ModuleBase& m)             { return makeUID ("mod_" + Program::stripRootNamespaceFromQualifiedPath (m.getFullyQualifiedDisplayPath().toString())); }